

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyBlockElimination.cc
# Opt level: O3

bool flow::transform::emptyBlockElimination(IRHandler *handler)

{
  _List_node_base *p_Var1;
  BasicBlock *this;
  Value *replacement;
  pointer ppBVar2;
  long *******ppppppplVar3;
  TerminateInstr *pTVar4;
  long lVar5;
  _List_node_base *p_Var6;
  Instr *this_00;
  long *******ppppppplVar7;
  pointer ppBVar8;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> eliminated;
  long *******local_48;
  long *******local_40;
  long local_38;
  
  local_40 = (long *******)&local_48;
  local_48 = (long *******)&local_48;
  local_38 = 0;
  p_Var1 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    ppppppplVar7 = (long *******)&local_48;
    if (p_Var1 == (_List_node_base *)&handler->blocks_) {
LAB_0014d080:
      while (lVar5 = local_38, ppppppplVar7 = (long *******)*ppppppplVar7,
            (long ********)ppppppplVar7 != &local_48) {
        IRHandler::erase(((BasicBlock *)ppppppplVar7[2])->handler_,(BasicBlock *)ppppppplVar7[2]);
      }
      ppppppplVar7 = local_48;
      while ((long ********)ppppppplVar7 != &local_48) {
        ppppppplVar3 = (long *******)*ppppppplVar7;
        operator_delete(ppppppplVar7,0x18);
        ppppppplVar7 = ppppppplVar3;
      }
      return lVar5 != 0;
    }
    this = (BasicBlock *)p_Var1[1]._M_next;
    if ((((long)(this->code_).
                super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->code_).
                super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 8) &&
        (pTVar4 = BasicBlock::getTerminator(this), pTVar4 != (TerminateInstr *)0x0)) &&
       (lVar5 = __dynamic_cast(pTVar4,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0), lVar5 != 0))
    {
      replacement = (Value *)**(undefined8 **)(lVar5 + 0x50);
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = (_List_node_base *)this;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      local_38 = local_38 + 1;
      if (this == (BasicBlock *)
                  (handler->blocks_).
                  super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next[1]._M_next) {
        IRHandler::setEntryBlock(handler,this);
        goto LAB_0014d080;
      }
      ppBVar2 = (this->predecessors_).
                super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppBVar8 = (this->predecessors_).
                     super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar2;
          ppBVar8 = ppBVar8 + 1) {
        this_00 = &BasicBlock::getTerminator(*ppBVar8)->super_Instr;
        Instr::replaceOperand(this_00,(Value *)this,replacement);
      }
    }
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool emptyBlockElimination(IRHandler* handler) {
  std::list<BasicBlock*> eliminated;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb->size() != 1)
      continue;

    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* newSuccessor = br->targetBlock();
      eliminated.push_back(bb);
      if (bb == handler->getEntryBlock()) {
        handler->setEntryBlock(bb);
        break;
      } else {
        for (BasicBlock* pred : bb->predecessors()) {
          pred->getTerminator()->replaceOperand(bb, newSuccessor);
        }
      }
    }
  }

  for (BasicBlock* bb : eliminated) {
    bb->getHandler()->erase(bb);
  }

  return eliminated.size() > 0;
}